

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::fboc::details::DistinctSizeTest::DistinctSizeTest
          (DistinctSizeTest *this,Context *group,char *name,char *desc)

{
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,desc,&local_5a);
  TestBase::TestBase(&this->super_TestBase,group,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_007282b8;
  return;
}

Assistant:

DistinctSizeTest	(Context& group,
										 const char* name, const char* desc)
						: TestBase		(group, name, desc) {}